

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O3

string * aeron::Context::defaultAeronPath_abi_cxx11_(void)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  long *plVar4;
  size_type *psVar5;
  string *in_RDI;
  char *__s;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar2 = getenv("USER");
  __s = "default";
  if (pcVar2 != (char *)0x0) {
    __s = pcVar2;
  }
  local_40[0] = local_30;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__s,__s + sVar3);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x14ff6d);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar1 = plVar4[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar4;
    (in_RDI->field_2)._M_allocated_capacity = *psVar5;
  }
  in_RDI->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return in_RDI;
}

Assistant:

inline static std::string defaultAeronPath()
    {
#if defined(__linux__)
        return "/dev/shm/aeron-" + getUserName();
#elif (_MSC_VER)
        return tmpDir() + "/aeron-" + getUserName();
#else
        return tmpDir() + "/aeron-" + getUserName();
#endif
    }